

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnData::Update
          (ColumnData *this,TransactionData transaction,idx_t column_index,Vector *update_vector,
          row_t *row_ids,idx_t update_count)

{
  int iVar1;
  undefined4 extraout_var;
  Vector base_vector;
  ColumnScanState state;
  LogicalType local_148;
  Vector local_130;
  ColumnScanState local_c8;
  
  LogicalType::LogicalType(&local_148,&this->type);
  Vector::Vector(&local_130,&local_148,0x800);
  LogicalType::~LogicalType(&local_148);
  local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_c8.current = (ColumnSegment *)0x0;
  local_c8.segment_tree = (ColumnSegmentTree *)0x0;
  local_c8.row_index = 0;
  local_c8.internal_index = 0;
  local_c8.initialized = false;
  local_c8.segment_checked = false;
  local_c8.scan_state.
  super_unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>._M_t.
  super___uniq_ptr_impl<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::SegmentScanState_*,_std::default_delete<duckdb::SegmentScanState>_>
  .super__Head_base<0UL,_duckdb::SegmentScanState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)
       (__uniq_ptr_data<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true,_true>
        )0x0;
  local_c8.child_states.
  super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
  super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.child_states.
  super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
  super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.child_states.
  super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
  super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.previous_states.
  super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.previous_states.
  super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.previous_states.
  super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.last_offset._0_4_ = 0;
  local_c8.last_offset._4_4_ = 0;
  local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_4_ = 0;
  local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._4_8_ = 0;
  local_c8.scan_child_column.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  local_c8.scan_options.ptr = (TableScanOptions *)0x0;
  iVar1 = (*this->_vptr_ColumnData[0x15])(this,&local_c8,*row_ids,&local_130);
  Vector::Flatten(&local_130,CONCAT44(extraout_var,iVar1));
  UpdateInternal(this,transaction,column_index,update_vector,row_ids,update_count,&local_130);
  ColumnScanState::~ColumnScanState(&local_c8);
  Vector::~Vector(&local_130);
  return;
}

Assistant:

void ColumnData::Update(TransactionData transaction, idx_t column_index, Vector &update_vector, row_t *row_ids,
                        idx_t update_count) {
	Vector base_vector(type);
	ColumnScanState state;
	auto fetch_count = Fetch(state, row_ids[0], base_vector);

	base_vector.Flatten(fetch_count);
	UpdateInternal(transaction, column_index, update_vector, row_ids, update_count, base_vector);
}